

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O2

int run_test_udp_no_autobind(void)

{
  int iVar1;
  uv_loop_t *loop;
  void *pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_6;
  uv_udp_t h2;
  uv_udp_t h;
  
  loop = uv_default_loop();
  iVar1 = uv_udp_init(loop,&h);
  pvVar2 = (void *)(long)iVar1;
  eval_b = 0;
  if (pvVar2 == (void *)0x0) {
    h2.data = (void *)0xfffffffffffffff7;
    iVar1 = uv_udp_set_multicast_ttl(&h,0x20);
    eval_b_6 = (int64_t)iVar1;
    if (h2.data == (void *)eval_b_6) {
      h2.data = (void *)0xfffffffffffffff7;
      iVar1 = uv_udp_set_broadcast(&h,1);
      eval_b_6 = (int64_t)iVar1;
      if (h2.data == (void *)eval_b_6) {
        h2.data = (void *)0xfffffffffffffff7;
        iVar1 = uv_udp_set_ttl(&h,1);
        eval_b_6 = (int64_t)iVar1;
        if (h2.data == (void *)eval_b_6) {
          h2.data = (void *)0xfffffffffffffff7;
          iVar1 = uv_udp_set_multicast_loop(&h,1);
          eval_b_6 = (int64_t)iVar1;
          if (h2.data == (void *)eval_b_6) {
            h2.data = (void *)0xfffffffffffffff7;
            iVar1 = uv_udp_set_multicast_interface(&h,"0.0.0.0");
            eval_b_6 = (int64_t)iVar1;
            if (h2.data == (void *)eval_b_6) {
              uv_close((uv_handle_t *)&h,(uv_close_cb)0x0);
              iVar1 = uv_udp_init_ex(loop,&h2,0x102);
              pvVar2 = (void *)(long)iVar1;
              eval_b_6 = 0;
              if (pvVar2 == (void *)0x0) {
                iVar1 = uv_udp_set_multicast_ttl(&h2,0x20);
                pvVar2 = (void *)(long)iVar1;
                eval_b_6 = 0;
                if (pvVar2 == (void *)0x0) {
                  iVar1 = uv_udp_set_broadcast(&h2,1);
                  pvVar2 = (void *)(long)iVar1;
                  eval_b_6 = 0;
                  if (pvVar2 == (void *)0x0) {
                    iVar1 = uv_udp_set_ttl(&h2,1);
                    pvVar2 = (void *)(long)iVar1;
                    eval_b_6 = 0;
                    if (pvVar2 == (void *)0x0) {
                      iVar1 = uv_udp_set_multicast_loop(&h2,1);
                      pvVar2 = (void *)(long)iVar1;
                      eval_b_6 = 0;
                      if (pvVar2 == (void *)0x0) {
                        iVar1 = uv_udp_set_multicast_interface(&h2,"0.0.0.0");
                        pvVar2 = (void *)(long)iVar1;
                        eval_b_6 = 0;
                        if (pvVar2 == (void *)0x0) {
                          uv_close((uv_handle_t *)&h2,(uv_close_cb)0x0);
                          iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                          pvVar2 = (void *)(long)iVar1;
                          eval_b_6 = 0;
                          if (pvVar2 == (void *)0x0) {
                            close_loop(loop);
                            eval_b = 0;
                            iVar1 = uv_loop_close(loop);
                            eval_b_6 = (int64_t)iVar1;
                            if ((void *)eval_b_6 == (void *)0x0) {
                              uv_library_shutdown();
                              return 0;
                            }
                            pcVar5 = "uv_loop_close(loop)";
                            pcVar4 = "0";
                            uVar3 = 0x9e;
                            pvVar2 = (void *)eval_b;
                          }
                          else {
                            pcVar5 = "0";
                            pcVar4 = "uv_run(loop, UV_RUN_DEFAULT)";
                            uVar3 = 0x9c;
                          }
                        }
                        else {
                          pcVar5 = "0";
                          pcVar4 = "uv_udp_set_multicast_interface(&h2, \"0.0.0.0\")";
                          uVar3 = 0x98;
                        }
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "uv_udp_set_multicast_loop(&h2, 1)";
                        uVar3 = 0x97;
                      }
                    }
                    else {
                      pcVar5 = "0";
                      pcVar4 = "uv_udp_set_ttl(&h2, 1)";
                      uVar3 = 0x94;
                    }
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "uv_udp_set_broadcast(&h2, 1)";
                    uVar3 = 0x8e;
                  }
                }
                else {
                  pcVar5 = "0";
                  pcVar4 = "uv_udp_set_multicast_ttl(&h2, 32)";
                  uVar3 = 0x8d;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "uv_udp_init_ex(loop, &h2, 2 | UV_UDP_RECVMMSG)";
                uVar3 = 0x8c;
              }
            }
            else {
              pcVar5 = "uv_udp_set_multicast_interface(&h, \"0.0.0.0\")";
              pcVar4 = "UV_EBADF";
              uVar3 = 0x87;
              pvVar2 = h2.data;
            }
          }
          else {
            pcVar5 = "uv_udp_set_multicast_loop(&h, 1)";
            pcVar4 = "UV_EBADF";
            uVar3 = 0x82;
            pvVar2 = h2.data;
          }
        }
        else {
          pcVar5 = "uv_udp_set_ttl(&h, 1)";
          pcVar4 = "UV_EBADF";
          uVar3 = 0x80;
          pvVar2 = h2.data;
        }
      }
      else {
        pcVar5 = "uv_udp_set_broadcast(&h, 1)";
        pcVar4 = "UV_EBADF";
        uVar3 = 0x7c;
        pvVar2 = h2.data;
      }
    }
    else {
      pcVar5 = "uv_udp_set_multicast_ttl(&h, 32)";
      pcVar4 = "UV_EBADF";
      uVar3 = 0x7b;
      pvVar2 = h2.data;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_udp_init(loop, &h)";
    uVar3 = 0x7a;
    eval_b_6 = eval_b;
    h2.data = pvVar2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
          ,uVar3,pcVar4,"==",pcVar5,pvVar2,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_no_autobind) {
  uv_loop_t* loop;
  uv_udp_t h;
  uv_udp_t h2;

  loop = uv_default_loop();

  /* Test a lazy initialized socket. */
  ASSERT_OK(uv_udp_init(loop, &h));
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_ttl(&h, 32));
  ASSERT_EQ(UV_EBADF, uv_udp_set_broadcast(&h, 1));
#if defined(__MVS__)
  ASSERT_EQ(UV_ENOTSUP, uv_udp_set_ttl(&h, 1));
#else
  ASSERT_EQ(UV_EBADF, uv_udp_set_ttl(&h, 1));
#endif
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_loop(&h, 1));
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_interface(&h, "0.0.0.0"));

  uv_close((uv_handle_t*) &h, NULL);

  /* Test a non-lazily initialized socket. */
  ASSERT_OK(uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG));
  ASSERT_OK(uv_udp_set_multicast_ttl(&h2, 32));
  ASSERT_OK(uv_udp_set_broadcast(&h2, 1));

#if defined(__MVS__)
  /* zOS only supports setting ttl for IPv6 sockets. */
  ASSERT_EQ(UV_ENOTSUP, uv_udp_set_ttl(&h2, 1));
#else
  ASSERT_OK(uv_udp_set_ttl(&h2, 1));
#endif

  ASSERT_OK(uv_udp_set_multicast_loop(&h2, 1));
  ASSERT_OK(uv_udp_set_multicast_interface(&h2, "0.0.0.0"));

  uv_close((uv_handle_t*) &h2, NULL);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}